

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystem.h
# Opt level: O3

void __thiscall chrono::collision::ChCollisionSystem::~ChCollisionSystem(ChCollisionSystem *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  this->_vptr_ChCollisionSystem = (_func_int **)&PTR__ChCollisionSystem_00b3cc38;
  p_Var1 = (this->vis_callback).
           super___shared_ptr<chrono::collision::ChCollisionSystem::VisualizationCallback,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->narrow_callback).
           super___shared_ptr<chrono::collision::ChCollisionSystem::NarrowphaseCallback,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->broad_callback).
           super___shared_ptr<chrono::collision::ChCollisionSystem::BroadphaseCallback,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

virtual ~ChCollisionSystem() {}